

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VtabDisconnect(sqlite3 *db,Table *p)

{
  VTable *pVTab_00;
  VTable **ppVVar1;
  VTable *pVTab;
  VTable **ppVVar2;
  
  ppVVar1 = &p->pVTable;
  do {
    ppVVar2 = ppVVar1;
    pVTab_00 = *ppVVar2;
    if (pVTab_00 == (VTable *)0x0) {
      return;
    }
    ppVVar1 = &pVTab_00->pNext;
  } while (pVTab_00->db != db);
  *ppVVar2 = pVTab_00->pNext;
  sqlite3VtabUnlock(pVTab_00);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabDisconnect(sqlite3 *db, Table *p){
  VTable **ppVTab;

  assert( IsVirtual(p) );
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  assert( sqlite3_mutex_held(db->mutex) );

  for(ppVTab=&p->pVTable; *ppVTab; ppVTab=&(*ppVTab)->pNext){
    if( (*ppVTab)->db==db  ){
      VTable *pVTab = *ppVTab;
      *ppVTab = pVTab->pNext;
      sqlite3VtabUnlock(pVTab);
      break;
    }
  }
}